

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O2

string * cs::get_sdk_path_abi_cxx11_(void)

{
  __uid_t __uid;
  char *pcVar1;
  passwd *ppVar2;
  string *in_RDI;
  string *this;
  allocator local_49;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  pcVar1 = getenv("COVSCRIPT_HOME");
  if (pcVar1 == (char *)0x0) {
    __uid = getuid();
    ppVar2 = getpwuid(__uid);
    std::__cxx11::string::string((string *)&local_28,ppVar2->pw_dir,&local_49);
    std::operator+(&local_48,&local_28,"/.covscript");
    process_path(in_RDI,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    this = &local_28;
  }
  else {
    std::__cxx11::string::string((string *)&local_48,pcVar1,(allocator *)&local_28);
    process_path(in_RDI,&local_48);
    this = &local_48;
  }
  std::__cxx11::string::~string((string *)this);
  return in_RDI;
}

Assistant:

std::string get_sdk_path()
	{
#ifdef COVSCRIPT_HOME
		return COVSCRIPT_HOME;
#else
		const char *sdk_path = std::getenv("COVSCRIPT_HOME");
		if (sdk_path == nullptr) {
			struct passwd *pw = getpwuid(getuid());
			return process_path(std::string(pw->pw_dir) + "/.covscript");
		}
		else
			return process_path(sdk_path);
#endif
	}